

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

int Gia_ManConeSize_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDfs.c"
                      ,0x153,"int Gia_ManConeSize_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManConeSize_rec(p,pGVar3);
      pGVar3 = Gia_ObjFanin1(pObj);
      iVar2 = Gia_ManConeSize_rec(p,pGVar3);
      p_local._4_4_ = iVar1 + 1 + iVar2;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManConeSize_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManConeSize_rec( p, Gia_ObjFanin0(pObj) ) +
        Gia_ManConeSize_rec( p, Gia_ObjFanin1(pObj) );
}